

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O2

string * __thiscall
flatbuffers::java::JavaGenerator::GenKeyGetter_abi_cxx11_
          (string *__return_storage_ptr__,JavaGenerator *this,FieldDef *key_field)

{
  string field_getter;
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_60);
  if ((key_field->value).type.base_type == BASE_TYPE_STRING) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    GenOffsetGetter_abi_cxx11_(&local_a0,this,key_field,"o1");
    std::operator+(&local_60,&local_a0,", ");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_a0);
    GenOffsetGetter_abi_cxx11_(&local_40,this,key_field,"o2");
    std::operator+(&local_80,&local_40,", ");
    std::operator+(&local_a0,&local_80,"_bb");
    std::operator+(&local_60,&local_a0,")");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"_bb",(allocator<char> *)&local_80);
    GenGetterForLookupByKey(&local_60,this,key_field,&local_a0,"o1");
    std::__cxx11::string::~string((string *)&local_a0);
    GenTypeNameDest_abi_cxx11_(&local_40,this,&(key_field->value).type);
    std::operator+(&local_80,"\n    ",&local_40);
    std::operator+(&local_a0,&local_80," val_1 = ");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_40);
    std::operator+(&local_80,&local_60,";\n    ");
    GenTypeNameDest_abi_cxx11_(&local_40,this,&(key_field->value).type);
    std::operator+(&local_a0,&local_80,&local_40);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_80,"_bb",(allocator<char> *)&local_40);
    GenGetterForLookupByKey(&local_a0,this,key_field,&local_80,"o2");
    std::__cxx11::string::operator=((string *)&local_60,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    std::operator+(&local_a0,&local_60,";\n");
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GenKeyGetter(flatbuffers::FieldDef *key_field) const {
    std::string key_getter = "";
    auto data_buffer = "_bb";
    if (IsString(key_field->value.type)) {
      key_getter += " return ";
      key_getter += "";
      key_getter += "compareStrings(";
      key_getter += GenOffsetGetter(key_field, "o1") + ", ";
      key_getter += GenOffsetGetter(key_field, "o2") + ", " + data_buffer + ")";
      key_getter += ";";
    } else {
      auto field_getter = GenGetterForLookupByKey(key_field, data_buffer, "o1");
      key_getter +=
          "\n    " + GenTypeNameDest(key_field->value.type) + " val_1 = ";
      key_getter +=
          field_getter + ";\n    " + GenTypeNameDest(key_field->value.type);
      key_getter += " val_2 = ";
      field_getter = GenGetterForLookupByKey(key_field, data_buffer, "o2");
      key_getter += field_getter + ";\n";
      key_getter += "    return val_1 > val_2 ? 1 : val_1 < val_2 ? -1 : 0;\n ";
    }
    return key_getter;
  }